

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ComponentManager.cpp
# Opt level: O3

ErrorCode __thiscall ComponentManager::AddService(ComponentManager *this,CID cid,ISupports *service)

{
  Node *pNVar1;
  Node *pNVar2;
  ClassInfo *pCVar3;
  Node *pNVar4;
  
  pCVar3 = (ClassInfo *)
           operator_new(0x10,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/src/ComponentManager.cpp"
                        ,0xe0);
  (pCVar3->mCid).mId = cid.mId;
  pCVar3->mClass = service;
  (**service->_vptr_ISupports)(service);
  pNVar4 = (Node *)operator_new(0x18,
                                "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/include/jh_list.h"
                                ,0xa7);
  pNVar4->val = pCVar3;
  pNVar1 = (this->mClasses).mTail;
  pNVar2 = pNVar1->prev;
  pNVar4->prev = pNVar2;
  pNVar4->next = pNVar1;
  pNVar2->next = pNVar4;
  pNVar1->prev = pNVar4;
  return kNoError;
}

Assistant:

ErrorCode ComponentManager::AddService( CID cid, ISupports *service )
{
	TRACE_BEGIN( LOG_LVL_INFO );
	ClassInfo *info = jh_new ClassInfo( cid, service );
	
	LOG( "Adding cid %s, ISupports %p", cid.toString(), service );
	
	service->AddRef();
	
	mClasses.push_back( info );
	
	return kNoError;
}